

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O1

void vpblendd(PDISASM pMyDisasm)

{
  if ((((pMyDisasm->Reserved_).EVEX.state != '\x01') && ((pMyDisasm->Reserved_).VEX.state == '\x01')
      ) && ((pMyDisasm->Reserved_).VEX.pp == '\x01')) {
    if ((pMyDisasm->Reserved_).REX.W_ == '\x01') {
      (pMyDisasm->Reserved_).ERROR_OPCODE = 2;
    }
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"vpblendd",9);
    ArgsVEX(pMyDisasm);
    getImmediat8(&pMyDisasm->Operand4,pMyDisasm);
    return;
  }
  builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"???",4);
  (pMyDisasm->Operand1).AccessMode = 0;
  (pMyDisasm->Operand2).AccessMode = 0;
  (pMyDisasm->Operand3).AccessMode = 0;
  (pMyDisasm->Operand4).AccessMode = 0;
  (pMyDisasm->Operand5).AccessMode = 0;
  (pMyDisasm->Operand6).AccessMode = 0;
  (pMyDisasm->Operand7).AccessMode = 0;
  (pMyDisasm->Operand8).AccessMode = 0;
  (pMyDisasm->Operand9).AccessMode = 0;
  (pMyDisasm->Reserved_).ERROR_OPCODE = -1;
  return;
}

Assistant:

void __bea_callspec__ vpblendd(PDISASM pMyDisasm)
{
  if (GV.EVEX.state == InUsePrefix) {
    failDecode(pMyDisasm);
  }
  else if (GV.VEX.state == InUsePrefix) {
    if (GV.VEX.pp == 1) {
      if (GV.REX.W_ == 1) GV.ERROR_OPCODE = UD_;
      #ifndef BEA_LIGHT_DISASSEMBLY
         (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vpblendd");
      #endif
      ArgsVEX(pMyDisasm);
      getImmediat8(&pMyDisasm->Operand4, pMyDisasm);
    }
    else {
      failDecode(pMyDisasm);
    }
  }
  else {
    failDecode(pMyDisasm);
  }
}